

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall Jupiter::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  uint uVar2;
  undefined4 in_register_00000034;
  long lVar4;
  addrinfo *info_local;
  Socket *this_local;
  Data *pDVar3;
  
  lVar4 = CONCAT44(in_register_00000034,__fd);
  iVar1 = socket(*(int *)(lVar4 + 4),this->m_data->sockType,this->m_data->sockProto);
  this->m_data->rawSock = iVar1;
  pDVar3 = this->m_data;
  if (pDVar3->rawSock == -1) {
LAB_001c4c5c:
    this_local._7_1_ = 0;
  }
  else {
    pDVar3 = this->m_data;
    if ((pDVar3->sockType != 3) && (pDVar3 = this->m_data, pDVar3->sockProto != 0xff)) {
      uVar2 = ::connect(this->m_data->rawSock,*(sockaddr **)(lVar4 + 0x18),
                        *(socklen_t *)(lVar4 + 0x10));
      pDVar3 = (Data *)(ulong)uVar2;
      if (uVar2 == 0xffffffff) goto LAB_001c4c5c;
    }
    this_local._7_1_ = 1;
  }
  return (int)CONCAT71((int7)((ulong)pDVar3 >> 8),this_local._7_1_);
}

Assistant:

bool Jupiter::Socket::connect(addrinfo *info) {
#if defined _WIN32
	if (!socketInit && !Jupiter::Socket::init()) {
		return false;
	}
#endif // _WIN32

	m_data->rawSock = socket(info->ai_family, m_data->sockType, m_data->sockProto);
	
	if (m_data->rawSock == INVALID_SOCKET
		|| (m_data->sockType != SOCK_RAW && m_data->sockProto != IPPROTO_RAW && ::connect(m_data->rawSock, info->ai_addr, info->ai_addrlen) == SOCKET_ERROR))
		return false;

	return true;
}